

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O3

int Abc_NtkMfsResub(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  Cnf_Dat_t *pCVar4;
  sat_solver *psVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_28;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  pVVar2 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar2;
  pVVar2 = Abc_NtkNodeSupport(p->pNtk,(Abc_Obj_t **)pVVar2->pArray,pVVar2->nSize);
  p->vSupp = pVVar2;
  pVVar2 = Abc_NtkDfsNodes(p->pNtk,(Abc_Obj_t **)p->vRoots->pArray,p->vRoots->nSize);
  p->vNodes = pVVar2;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  p->timeWin = p->timeWin + lVar7 + lVar6;
  iVar1 = p->pPars->nWinMax;
  if ((iVar1 == 0) || (p->vNodes->nSize <= iVar1)) {
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_28.tv_sec * -1000000;
    }
    iVar1 = Abc_ObjRequiredLevel(pNode);
    pVVar2 = Abc_MfsComputeDivisors(p,pNode,iVar1 + -1);
    p->vDivs = pVVar2;
    p->nTotalDivs = p->nTotalDivs + (pVVar2->nSize - (pNode->vFanins).nSize);
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    p->timeDiv = p->timeDiv + lVar7 + lVar6;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_28.tv_sec * -1000000;
    }
    pAVar3 = Abc_NtkConstructAig(p,pNode);
    p->pAigWin = pAVar3;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    p->timeAig = p->timeAig + lVar7 + lVar6;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_28.tv_sec * -1000000;
    }
    pCVar4 = Cnf_DeriveSimple(p->pAigWin,p->vDivs->nSize + 1);
    p->pCnf = pCVar4;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    p->timeCnf = p->timeCnf + lVar7 + lVar6;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_28.tv_sec * -1000000;
    }
    psVar5 = Abc_MfsCreateSolverResub(p,(int *)0x0,0,0);
    p->pSat = psVar5;
    if (psVar5 == (sat_solver *)0x0) {
      p->nNodesBad = p->nNodesBad + 1;
    }
    else {
      if (p->pPars->fPower == 0) {
        if (p->pPars->fSwapEdge == 0) {
          Abc_NtkMfsResubNode(p,pNode);
          if (p->pPars->fMoreEffort != 0) {
            Abc_NtkMfsResubNode2(p,pNode);
          }
        }
        else {
          Abc_NtkMfsEdgeSwapEval(p,pNode);
        }
      }
      else {
        Abc_NtkMfsEdgePower(p,pNode);
      }
      iVar1 = clock_gettime(3,&local_28);
      if (iVar1 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar7 + lVar6;
    }
  }
  else {
    p->nMaxDivs = p->nMaxDivs + 1;
  }
  return 1;
}

Assistant:

int Abc_NtkMfsResub( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    if ( p->pPars->nWinMax && Vec_PtrSize(p->vNodes) > p->pPars->nWinMax )
    {
        p->nMaxDivs++;
        return 1;
    }
    // compute the divisors of the window
clk = Abc_Clock();
    p->vDivs  = Abc_MfsComputeDivisors( p, pNode, Abc_ObjRequiredLevel(pNode) - 1 );
    p->nTotalDivs += Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode);
p->timeDiv += Abc_Clock() - clk;
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, 1 + Vec_PtrSize(p->vDivs) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = Abc_MfsCreateSolverResub( p, NULL, 0, 0 );
    if ( p->pSat == NULL )
    {
        p->nNodesBad++;
        return 1;
    }
//clk = Abc_Clock();
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsConstructGia( p );
//p->timeGia += Abc_Clock() - clk;
    // solve the SAT problem
    if ( p->pPars->fPower )
        Abc_NtkMfsEdgePower( p, pNode );
    else if ( p->pPars->fSwapEdge )
        Abc_NtkMfsEdgeSwapEval( p, pNode );
    else
    {
        Abc_NtkMfsResubNode( p, pNode );
        if ( p->pPars->fMoreEffort )
            Abc_NtkMfsResubNode2( p, pNode );
    }
p->timeSat += Abc_Clock() - clk;
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsDeconstructGia( p );
    return 1;
}